

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_sta_indexed_indirect_Test::TestBody
          (CpuTest_sta_indexed_indirect_Test *this)

{
  ushort uVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar5;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar6;
  MockSpec<void_(unsigned_short,_unsigned_char)> *this_00;
  char *message;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  Matcher<unsigned_char> local_240;
  Matcher<unsigned_short> local_228;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_210;
  ReturnAction<int> local_1d8;
  Action<unsigned_char_(unsigned_short)> local_1c8;
  WithoutMatchers local_1a1;
  Matcher<unsigned_short> local_1a0;
  MockSpec<unsigned_char_(unsigned_short)> local_188;
  ReturnAction<int> local_168;
  Action<unsigned_char_(unsigned_short)> local_158;
  WithoutMatchers local_131;
  Matcher<unsigned_short> local_130;
  MockSpec<unsigned_char_(unsigned_short)> local_118;
  ReturnAction<int> local_f8;
  Action<unsigned_char_(unsigned_short)> local_e8;
  WithoutMatchers local_c1;
  Matcher<unsigned_short> local_c0;
  MockSpec<unsigned_char_(unsigned_short)> local_a8;
  ReturnAction<int> local_88;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_sta_indexed_indirect_Test *local_10;
  CpuTest_sta_indexed_indirect_Test *this_local;
  
  (this->super_CpuTest).expected.pc = 0x4321;
  (this->super_CpuTest).registers.pc = 0x4321;
  (this->super_CpuTest).expected.x = 0xed;
  (this->super_CpuTest).registers.x = 0xed;
  (this->super_CpuTest).expected.a = '\a';
  (this->super_CpuTest).registers.a = '\a';
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,0x81);
  uVar1 = (this->super_CpuTest).expected.pc;
  if (!SCARRY4((uint)uVar1,1)) {
    (this->super_CpuTest).expected.pc = uVar1 + 1;
    testing::Matcher<unsigned_short>::Matcher(&local_48,0x4322);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_30,local_55,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x2f4,"mmu","read_byte(0x4322)");
    testing::Return<int>((testing *)&local_88,0xab);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_78);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
    testing::Matcher<unsigned_short>::~Matcher(&local_48);
    testing::Matcher<unsigned_short>::Matcher(&local_c0,0xab);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_c0);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_a8,&local_c1,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x2f5,"mmu","read_byte(0xAB)");
    testing::Return<int>((testing *)&local_f8,0);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_e8,(ReturnAction *)&local_f8);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_e8);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_e8);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_f8);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_a8);
    testing::Matcher<unsigned_short>::~Matcher(&local_c0);
    bVar3 = n_e_s::core::test::u16_to_u8(0x198);
    testing::Matcher<unsigned_short>::Matcher(&local_130,(ushort)bVar3);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_118,&(this->super_CpuTest).mmu.super_MockMmu,&local_130);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_118,&local_131,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x2f6,"mmu","read_byte(u16_to_u8(0xAB + 0xED))");
    testing::Return<int>((testing *)&local_168,0x34);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_158,(ReturnAction *)&local_168);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_158)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_158);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_168);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_118);
    testing::Matcher<unsigned_short>::~Matcher(&local_130);
    bVar3 = n_e_s::core::test::u16_to_u8(0x199);
    testing::Matcher<unsigned_short>::Matcher(&local_1a0,(ushort)bVar3);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_188,&(this->super_CpuTest).mmu.super_MockMmu,&local_1a0);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_188,&local_1a1,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x2f7,"mmu","read_byte(u16_to_u8(0xAB + 0xED + 1u))");
    testing::Return<int>((testing *)&local_1d8,0x12);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_1c8,(ReturnAction *)&local_1d8);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_1c8)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_1c8);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_1d8);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_188);
    testing::Matcher<unsigned_short>::~Matcher(&local_1a0);
    testing::Matcher<unsigned_short>::Matcher(&local_228,0x1234);
    testing::Matcher<unsigned_char>::Matcher(&local_240,'\a');
    n_e_s::core::test::MockMmu::gmock_write_byte
              (&local_210,&(this->super_CpuTest).mmu.super_MockMmu,&local_228,&local_240);
    testing::internal::GetWithoutMatchers();
    this_00 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                        (&local_210,
                         (WithoutMatchers *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7),(void *)0x0);
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x2f9,"mmu","write_byte(0x1234, 0x07)");
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_210);
    testing::Matcher<unsigned_char>::~Matcher(&local_240);
    testing::Matcher<unsigned_short>::~Matcher(&local_228);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x06');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_258,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar4) {
      testing::Message::Message(&local_260);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                 ,0x2fd,message);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message(&local_260);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TEST_F(CpuTest, sta_indexed_indirect) {
    registers.pc = expected.pc = 0x4321;
    registers.x = expected.x = 0xED;
    registers.a = expected.a = 0x07;

    stage_instruction(STA_INXIND);

    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(0x4322)).WillOnce(Return(0xAB));
    EXPECT_CALL(mmu, read_byte(0xAB)).WillOnce(Return(0x00)); // Dummy read
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED))).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED + 1u)))
            .WillOnce(Return(0x12));
    EXPECT_CALL(mmu, write_byte(0x1234, 0x07));

    step_execution(6);

    EXPECT_EQ(expected, registers);
}